

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode multi_runsingle(Curl_multi *multi,timeval now,Curl_easy *data)

{
  byte bVar1;
  curl_off_t cVar2;
  Curl_do_more_func p_Var3;
  char *pcVar4;
  _func_CURLcode_connectdata_ptr__Bool_ptr *p_Var5;
  Curl_easy *pCVar6;
  curl_llist_element *pcVar7;
  timeval now_00;
  timeval now_01;
  timeval now_02;
  timeval now_03;
  timeval newer;
  timeval newer_00;
  timeval newer_01;
  timeval now_04;
  _Bool _Var8;
  CURLcode CVar9;
  CURLcode status;
  uint uVar10;
  CURLcode CVar11;
  int iVar12;
  int iVar13;
  CURLMcode CVar14;
  connectdata *pcVar15;
  time_t tVar16;
  Curl_dns_entry *pCVar17;
  long lVar18;
  long lVar19;
  CURLMstate CVar20;
  followtype type;
  connectdata **ppcVar21;
  bool bVar22;
  _Bool protocol_connect;
  _Bool dophase_done;
  _Bool done;
  _Bool comeback;
  char *newurl;
  connectdata **local_60;
  _Bool async;
  _Bool connected;
  _Bool local_55;
  int control;
  timeval now_local;
  
  now_local.tv_usec = now.tv_usec;
  now_local.tv_sec = now.tv_sec;
  protocol_connect = false;
  dophase_done = false;
  done = false;
  CVar14 = CURLM_BAD_EASY_HANDLE;
  if ((data != (Curl_easy *)0x0) && (data->magic == 0xc0dedbad)) {
    ppcVar21 = &data->easy_conn;
    status = CURLE_OK;
    local_60 = ppcVar21;
LAB_0012a88a:
    do {
      if ((data->state).pipe_broke == true) {
        iVar13 = 0;
        Curl_infof(data,"Pipe broke: handle %p, url = %s\n",data,(data->state).path);
        if (data->mstate < CURLM_STATE_COMPLETED) {
          mstate(data,CURLM_STATE_CONNECT);
          status = CURLE_OK;
          iVar13 = -1;
        }
        (data->state).pipe_broke = false;
        data->easy_conn = (connectdata *)0x0;
        goto LAB_0012b6de;
      }
      pcVar15 = *ppcVar21;
      if ((pcVar15 == (connectdata *)0x0) && (data->mstate - CURLM_STATE_WAITRESOLVE < 0xd)) {
        Curl_failf(data,"In state %d with no easy_conn, bail out!\n");
        return CURLM_INTERNAL_ERROR;
      }
      _Var8 = multi->recheckstate;
      multi->recheckstate = false;
      if (_Var8 == true) {
        Curl_multi_process_pending_handles(multi);
        pcVar15 = *ppcVar21;
      }
      CVar20 = data->mstate;
      if (pcVar15 != (connectdata *)0x0) {
        if (CVar20 - CURLM_STATE_WAITRESOLVE < 0xe) {
          pcVar15->data = data;
        }
        else if (0xe < CVar20 - CURLM_STATE_CONNECT) goto LAB_0012a94b;
        tVar16 = Curl_timeleft(data,&now_local,CVar20 < CURLM_STATE_DO);
        CVar20 = data->mstate;
        if (-1 < tVar16) goto LAB_0012a94b;
        if (CVar20 == CURLM_STATE_WAITCONNECT) {
          newer_00.tv_usec = now_local.tv_usec;
          newer_00.tv_sec = now_local.tv_sec;
          tVar16 = curlx_tvdiff(newer_00,(data->progress).t_startsingle);
          Curl_failf(data,"Connection timed out after %ld milliseconds",tVar16);
        }
        else if (CVar20 == CURLM_STATE_WAITRESOLVE) {
          newer.tv_usec = now_local.tv_usec;
          newer.tv_sec = now_local.tv_sec;
          tVar16 = curlx_tvdiff(newer,(data->progress).t_startsingle);
          Curl_failf(data,"Resolving timed out after %ld milliseconds",tVar16);
        }
        else {
          lVar18 = (data->req).size;
          newer_01.tv_usec = now_local.tv_usec;
          newer_01.tv_sec = now_local.tv_sec;
          tVar16 = curlx_tvdiff(newer_01,(data->progress).t_startsingle);
          cVar2 = (data->req).bytecount;
          if (lVar18 == -1) {
            Curl_failf(data,"Operation timed out after %ld milliseconds with %lld bytes received",
                       tVar16,cVar2);
          }
          else {
            Curl_failf(data,
                       "Operation timed out after %ld milliseconds with %lld out of %lld bytes received"
                       ,tVar16,cVar2,(data->req).size);
          }
        }
        bVar22 = CURLM_STATE_DO < data->mstate;
        if (bVar22) {
          Curl_conncontrol(*ppcVar21,2);
        }
        status = CURLE_OPERATION_TIMEDOUT;
        multi_done(ppcVar21,CURLE_OPERATION_TIMEDOUT,true);
        goto LAB_0012b5bb;
      }
LAB_0012a94b:
      iVar12 = 0;
      iVar13 = 0;
      switch(CVar20) {
      case CURLM_STATE_INIT:
        status = Curl_pretransfer(data);
        if (status != CURLE_OK) goto LAB_0012af9c;
        mstate(data,CURLM_STATE_CONNECT);
        Curl_pgrsTime(data,TIMER_STARTOP);
LAB_0012b5cb:
        bVar22 = false;
LAB_0012b5ce:
        status = CURLE_OK;
        goto LAB_0012b5d0;
      case CURLM_STATE_CONNECT_PEND:
switchD_0012a967_caseD_1:
        bVar22 = false;
        iVar13 = 0;
        break;
      case CURLM_STATE_CONNECT:
        Curl_pgrsTime(data,TIMER_STARTSINGLE);
        status = Curl_connect(data,ppcVar21,&async,&protocol_connect);
        if (status != CURLE_OK) {
          if (status == CURLE_NO_CONNECTION_AVAILABLE) {
            mstate(data,CURLM_STATE_CONNECT_PEND);
            iVar13 = Curl_llist_insert_next(multi->pending,multi->pending->tail,data);
            bVar22 = false;
            status = CURLE_OK;
            if (iVar13 == 0) {
              status = CURLE_OUT_OF_MEMORY;
            }
            goto LAB_0012b5bb;
          }
          goto switchD_0012a967_caseD_1;
        }
        status = Curl_add_handle_to_pipeline(data,data->easy_conn);
        if (status == CURLE_OK) {
          if (async != true) {
            if (protocol_connect == true) goto LAB_0012b13b;
            if ((*ppcVar21)->tunnel_state[0] == TUNNEL_CONNECT) goto LAB_0012ad4e;
            CVar20 = CURLM_STATE_WAITCONNECT;
            goto LAB_0012b5c6;
          }
          CVar20 = CURLM_STATE_WAITRESOLVE;
          goto LAB_0012b5b0;
        }
LAB_0012ae4c:
        bVar22 = true;
        iVar13 = 0;
        break;
      case CURLM_STATE_WAITRESOLVE:
        pcVar15 = *ppcVar21;
        lVar18 = 0x148;
        if (((pcVar15->bits).httpproxy == false) &&
           (lVar18 = 0xc0, (pcVar15->bits).conn_to_host != false)) {
          lVar18 = 0xe8;
        }
        pcVar4 = *(char **)((pcVar15->chunk).hexbuffer + lVar18 + -8);
        pCVar17 = Curl_fetch_addr(pcVar15,pcVar4,(int)pcVar15->port);
        if (pCVar17 != (Curl_dns_entry *)0x0) {
          Curl_infof(data,"Hostname \'%s\' was found in DNS cache\n",pcVar4);
          singlesocket(multi,data);
          if (protocol_connect == true) {
LAB_0012b13b:
            CVar20 = (CURLMstate)multi->pipelining & CURLM_STATE_CONNECT_PEND ^ CURLM_STATE_DO;
          }
          else if ((*ppcVar21)->tunnel_state[0] == TUNNEL_CONNECT) {
LAB_0012ad4e:
            CVar20 = CURLM_STATE_WAITPROXYCONNECT;
          }
          else {
            CVar20 = CURLM_STATE_WAITCONNECT;
          }
LAB_0012b5c6:
          mstate(data,CVar20);
          goto LAB_0012b5cb;
        }
        singlesocket(multi,data);
        bVar22 = true;
        iVar13 = 0;
        status = CURLE_COULDNT_RESOLVE_HOST;
        break;
      case CURLM_STATE_WAITCONNECT:
        status = Curl_is_connected(*ppcVar21,0,&connected);
        if ((status == CURLE_OK & connected) == 1) {
          pcVar15 = *ppcVar21;
          if ((((pcVar15->http_proxy).proxytype == CURLPROXY_HTTPS) &&
              ((pcVar15->bits).proxy_ssl_connected[0] != true)) ||
             (pcVar15->tunnel_state[0] == TUNNEL_CONNECT)) {
            CVar20 = CURLM_STATE_WAITPROXYCONNECT;
            goto LAB_0012b5b0;
          }
          bVar1 = (pcVar15->bits).tunnel_proxy;
          iVar13 = 6;
LAB_0012b1b8:
          CVar20 = iVar13 - (uint)bVar1;
          goto LAB_0012b5c6;
        }
        bVar22 = status != CURLE_OK;
        iVar13 = 0;
        break;
      case CURLM_STATE_WAITPROXYCONNECT:
        status = Curl_http_connect(*ppcVar21,&protocol_connect);
        pcVar15 = *ppcVar21;
        if ((pcVar15->bits).proxy_connect_closed == true) {
          bVar22 = false;
          multi_done(ppcVar21,CURLE_OK,false);
LAB_0012adb7:
          CVar20 = CURLM_STATE_CONNECT;
LAB_0012adbc:
          mstate(data,CVar20);
          goto LAB_0012b5ce;
        }
        if (status == CURLE_OK) {
          if ((pcVar15->http_proxy).proxytype == CURLPROXY_HTTPS) {
            bVar22 = false;
            iVar13 = 0;
            status = CURLE_OK;
            if ((pcVar15->bits).proxy_ssl_connected[0] != true) break;
          }
          bVar22 = false;
          iVar13 = 0;
          status = CURLE_OK;
          if (pcVar15->tunnel_state[0] != TUNNEL_CONNECT) {
            CVar20 = CURLM_STATE_SENDPROTOCONNECT;
            goto LAB_0012b5c6;
          }
          break;
        }
        goto LAB_0012af9c;
      case CURLM_STATE_SENDPROTOCONNECT:
        status = Curl_protocol_connect(*ppcVar21,&protocol_connect);
        if (protocol_connect != false) {
          if (status == CURLE_OK) goto LAB_0012b13b;
LAB_0012ae0b:
          Curl_posttransfer(data);
          _Var8 = true;
LAB_0012ae47:
          multi_done(ppcVar21,status,_Var8);
          goto LAB_0012ae4c;
        }
        mstate(data,CURLM_STATE_PROTOCONNECT);
        goto LAB_0012af9c;
      case CURLM_STATE_PROTOCONNECT:
        status = Curl_protocol_connecting(*ppcVar21,&protocol_connect);
        if (status != CURLE_OK) goto LAB_0012ae0b;
        bVar22 = false;
        iVar13 = 0;
        status = CURLE_OK;
        if (protocol_connect == true) goto LAB_0012b13b;
        break;
      case CURLM_STATE_WAITDO:
        _Var8 = Curl_pipeline_checkget_write(data,data->easy_conn);
        bVar22 = false;
        if (!_Var8) goto LAB_0012b5bb;
        CVar20 = CURLM_STATE_DO;
        goto LAB_0012b283;
      case CURLM_STATE_DO:
        pcVar15 = data->easy_conn;
        if ((data->set).connect_only == true) {
          bVar22 = false;
          Curl_conncontrol(pcVar15,0);
          mstate(data,CURLM_STATE_DONE);
          ppcVar21 = local_60;
          iVar13 = -1;
          status = CURLE_OK;
        }
        else {
          p_Var5 = pcVar15->handler->do_it;
          if (p_Var5 == (_func_CURLcode_connectdata_ptr__Bool_ptr *)0x0) {
LAB_0012b556:
            ppcVar21 = local_60;
            if (dophase_done == false) {
              if (((data->set).wildcardmatch == true) &&
                 (((data->wildcard).state | CURLWC_DOWNLOADING) == CURLWC_DONE)) {
                bVar22 = false;
                multi_done(local_60,CURLE_OK,false);
                CVar20 = CURLM_STATE_DONE;
                goto LAB_0012adbc;
              }
              CVar20 = CURLM_STATE_DOING;
            }
            else {
              if (((*local_60)->bits).do_more != true) {
                CVar20 = CURLM_STATE_DO_DONE;
                goto LAB_0012b5c6;
              }
              CVar20 = CURLM_STATE_DO_MORE;
            }
LAB_0012b5b0:
            mstate(data,CVar20);
            goto LAB_0012b5b6;
          }
          pCVar6 = pcVar15->data;
          status = (*p_Var5)(pcVar15,&dophase_done);
          if (status == CURLE_SEND_ERROR) {
            if (((pcVar15->bits).reuse == true) && (pCVar6->multi == (Curl_multi *)0x0)) {
              pcVar15 = *local_60;
              pCVar6 = pcVar15->data;
              newurl = (char *)pcVar15;
              Curl_infof(pCVar6,"Re-used connection seems dead, get a new one\n");
              Curl_conncontrol(pcVar15,1);
              status = multi_done((connectdata **)&newurl,CURLE_OK,false);
              *local_60 = (connectdata *)0x0;
              if ((status == CURLE_SEND_ERROR) || (status == CURLE_OK)) {
                local_55 = true;
                status = Curl_connect(pCVar6,local_60,&comeback,&local_55);
                if ((status == CURLE_OK) && (status = CURLE_COULDNT_RESOLVE_HOST, comeback != true))
                {
                  pcVar15 = *local_60;
                  status = (*pcVar15->handler->do_it)(pcVar15,&dophase_done);
                  goto LAB_0012b467;
                }
              }
              goto LAB_0012b471;
            }
LAB_0012b47f:
            ppcVar21 = local_60;
            status = CURLE_SEND_ERROR;
            if (((*local_60)->bits).reuse == true) {
              newurl = (char *)0x0;
              CVar9 = Curl_retry_request(*local_60,&newurl);
              pcVar4 = newurl;
              status = CVar9;
              if (CVar9 == CURLE_OK) {
                status = CURLE_SEND_ERROR;
              }
              Curl_posttransfer(data);
              CVar11 = multi_done(ppcVar21,status,false);
              bVar22 = CVar9 != CURLE_OK;
              if ((bVar22) || (pcVar4 == (char *)0x0)) {
                (*Curl_cfree)(newurl);
                bVar22 = true;
                ppcVar21 = local_60;
              }
              else {
                if ((CVar11 == CURLE_SEND_ERROR) || (CVar11 == CURLE_OK)) {
                  status = Curl_follow(data,newurl,FOLLOW_RETRY);
                  ppcVar21 = local_60;
                  if (status != CURLE_OK) goto LAB_0012b418;
                  goto LAB_0012adb7;
                }
                (*Curl_cfree)(newurl);
                ppcVar21 = local_60;
                iVar13 = iVar12;
                status = CVar11;
              }
              break;
            }
          }
          else {
LAB_0012b467:
            if (status == CURLE_OK) {
              if (dophase_done == true) {
                do_complete(pcVar15);
              }
              goto LAB_0012b556;
            }
LAB_0012b471:
            if (status == CURLE_SEND_ERROR) goto LAB_0012b47f;
          }
          ppcVar21 = local_60;
          Curl_posttransfer(data);
          bVar22 = true;
          iVar13 = 0;
          if (data->easy_conn != (connectdata *)0x0) {
            multi_done(ppcVar21,status,false);
            iVar13 = 0;
          }
        }
        break;
      case CURLM_STATE_DOING:
        status = Curl_protocol_doing(*ppcVar21,&dophase_done);
        if (status != CURLE_OK) {
LAB_0012ae33:
          Curl_posttransfer(data);
          _Var8 = false;
          goto LAB_0012ae47;
        }
        bVar22 = false;
        iVar13 = 0;
        status = CURLE_OK;
        if (dophase_done == true) {
          bVar1 = (data->easy_conn->bits).do_more;
          iVar13 = 0xc;
          goto LAB_0012b1b8;
        }
        break;
      case CURLM_STATE_DO_MORE:
        pcVar15 = *ppcVar21;
        control = 0;
        p_Var3 = pcVar15->handler->do_more;
        if (p_Var3 != (Curl_do_more_func)0x0) {
          status = (*p_Var3)(pcVar15,&control);
          if (status != CURLE_OK) goto LAB_0012ae33;
          if (control == 1) {
            do_complete(pcVar15);
          }
          if (control != 0) {
            CVar20 = (uint)(control == 1) * 2 + CURLM_STATE_DOING;
            goto LAB_0012b5c6;
          }
        }
LAB_0012b5b6:
        bVar22 = false;
        status = CURLE_OK;
        goto LAB_0012b5bb;
      case CURLM_STATE_DO_DONE:
        Curl_move_handle_from_send_to_recv_pipe(data,data->easy_conn);
        Curl_multi_process_pending_handles(multi);
        if ((data->easy_conn->sockfd == -1) && (data->easy_conn->writesockfd == -1)) {
          CVar20 = CURLM_STATE_DONE;
        }
        else {
          CVar20 = CURLM_STATE_WAITPERFORM;
        }
        goto LAB_0012b283;
      case CURLM_STATE_WAITPERFORM:
        _Var8 = Curl_pipeline_checkget_read(data,data->easy_conn);
        bVar22 = false;
        if (!_Var8) goto LAB_0012b5bb;
        CVar20 = CURLM_STATE_PERFORM;
        goto LAB_0012b283;
      case CURLM_STATE_PERFORM:
        newurl = (char *)0x0;
        comeback = false;
        lVar18 = (data->set).max_send_speed;
        if (lVar18 < 1) {
          lVar18 = 0;
        }
        else {
          now_00.tv_usec = now_local.tv_usec;
          now_00.tv_sec = now_local.tv_sec;
          lVar18 = Curl_pgrsLimitWaitTime
                             ((data->progress).uploaded,(data->progress).ul_limit_size,lVar18,
                              (data->progress).ul_limit_start,now_00);
        }
        lVar19 = (data->set).max_recv_speed;
        if (lVar19 < 1) {
          lVar19 = 0;
        }
        else {
          now_01.tv_usec = now_local.tv_usec;
          now_01.tv_sec = now_local.tv_sec;
          lVar19 = Curl_pgrsLimitWaitTime
                             ((data->progress).downloaded,(data->progress).dl_limit_size,lVar19,
                              (data->progress).dl_limit_start,now_01);
        }
        if ((lVar18 < 1) && (lVar19 < 1)) {
          status = Curl_readwrite(data->easy_conn,data,&done,&comeback);
          uVar10 = (data->req).keepon;
          if ((uVar10 & 1) == 0) {
            Curl_pipeline_leave_read(data->easy_conn);
            uVar10 = (data->req).keepon;
          }
          ppcVar21 = local_60;
          if ((uVar10 & 2) == 0) {
            Curl_pipeline_leave_write(*local_60);
          }
          if ((((status == CURLE_RECV_ERROR | done) == 1) &&
              (CVar9 = Curl_retry_request(*ppcVar21,&newurl), CVar9 == CURLE_OK)) &&
             (newurl != (char *)0x0)) {
            done = true;
            status = CURLE_UNSUPPORTED_PROTOCOL;
LAB_0012b1da:
            Curl_posttransfer(data);
            Curl_removeHandleFromPipeline(data,data->easy_conn->recv_pipe);
            pcVar7 = data->easy_conn->recv_pipe->head;
            if (pcVar7 != (curl_llist_element *)0x0) {
              Curl_expire_latest((Curl_easy *)pcVar7->ptr,0);
            }
            Curl_multi_process_pending_handles(multi);
            if ((~(byte)status & (data->req).newurl == (char *)0x0) == 0) {
              type = FOLLOW_RETRY;
              if ((byte)status == 0) {
                (*Curl_cfree)(newurl);
                newurl = (data->req).newurl;
                (data->req).newurl = (char *)0x0;
                type = FOLLOW_REDIR;
              }
              iVar12 = 0;
              status = multi_done(ppcVar21,CURLE_OK,false);
              if (status != CURLE_OK) goto LAB_0012b33a;
              status = Curl_follow(data,newurl,type);
              if (status != CURLE_OK) goto LAB_0012b101;
              mstate(data,CURLM_STATE_CONNECT);
              newurl = (char *)0x0;
              bVar22 = false;
              status = CURLE_OK;
            }
            else {
              if ((data->req).location == (char *)0x0) {
LAB_0012b404:
                bVar22 = false;
                status = CURLE_OK;
              }
              else {
                (*Curl_cfree)(newurl);
                newurl = (data->req).location;
                (data->req).location = (char *)0x0;
                status = Curl_follow(data,newurl,FOLLOW_FAKE);
                if (status == CURLE_OK) {
                  newurl = (char *)0x0;
                  goto LAB_0012b404;
                }
                bVar22 = true;
              }
              mstate(data,CURLM_STATE_DONE);
            }
            iVar12 = -1;
          }
          else if (status == CURLE_OK) {
            status = CURLE_OK;
            if ((done & 1U) != 0) goto LAB_0012b1da;
            iVar12 = -(uint)comeback;
LAB_0012b33a:
            bVar22 = false;
          }
          else {
            if ((status != CURLE_HTTP2_STREAM) && (((*ppcVar21)->handler->flags & 2) == 0)) {
              Curl_conncontrol(*ppcVar21,2);
            }
            Curl_posttransfer(data);
            multi_done(ppcVar21,status,true);
LAB_0012b101:
            bVar22 = false;
            iVar12 = 0;
          }
LAB_0012b418:
          (*Curl_cfree)(newurl);
          iVar13 = iVar12;
        }
        else {
          mstate(data,CURLM_STATE_TOOFAST);
          if (lVar18 < lVar19) {
            lVar18 = lVar19;
          }
          Curl_expire_latest(data,lVar18);
LAB_0012b3f1:
          bVar22 = false;
          ppcVar21 = local_60;
          iVar13 = 0;
        }
        break;
      case CURLM_STATE_TOOFAST:
        iVar12 = Curl_pgrsUpdate(*ppcVar21);
        bVar22 = false;
        iVar13 = 0;
        status = CURLE_ABORTED_BY_CALLBACK;
        if (iVar12 == 0) {
          now_04.tv_usec = now_local.tv_usec;
          now_04.tv_sec = now_local.tv_sec;
          status = Curl_speedcheck(data,now_04);
          if (status == CURLE_OK) {
            lVar18 = (data->set).max_send_speed;
            if (lVar18 < 1) {
              lVar18 = 0;
            }
            else {
              now_02.tv_usec = now_local.tv_usec;
              now_02.tv_sec = now_local.tv_sec;
              lVar18 = Curl_pgrsLimitWaitTime
                                 ((data->progress).uploaded,(data->progress).ul_limit_size,lVar18,
                                  (data->progress).ul_limit_start,now_02);
            }
            lVar19 = (data->set).max_recv_speed;
            if (lVar19 < 1) {
              lVar19 = 0;
            }
            else {
              now_03.tv_usec = now_local.tv_usec;
              now_03.tv_sec = now_local.tv_sec;
              lVar19 = Curl_pgrsLimitWaitTime
                                 ((data->progress).downloaded,(data->progress).dl_limit_size,lVar19,
                                  (data->progress).dl_limit_start,now_03);
            }
            if ((lVar18 < 1) && (lVar19 < 1)) {
              mstate(data,CURLM_STATE_PERFORM);
            }
            else {
              if (lVar18 < lVar19) {
                lVar18 = lVar19;
              }
              Curl_expire_latest(data,lVar18);
            }
            status = CURLE_OK;
            goto LAB_0012b3f1;
          }
          goto LAB_0012af9c;
        }
        break;
      case CURLM_STATE_DONE:
        if (*ppcVar21 != (connectdata *)0x0) {
          Curl_removeHandleFromPipeline(data,(*ppcVar21)->recv_pipe);
          Curl_multi_process_pending_handles(multi);
          CVar9 = multi_done(ppcVar21,status,false);
          if (status == CURLE_OK) {
            status = CVar9;
          }
          if (data->easy_conn != (connectdata *)0x0) {
            *ppcVar21 = (connectdata *)0x0;
          }
        }
        if (((data->set).wildcardmatch == true) && ((data->wildcard).state != CURLWC_DONE)) {
          bVar22 = false;
          mstate(data,CURLM_STATE_INIT);
          goto LAB_0012b5d0;
        }
        CVar20 = CURLM_STATE_COMPLETED;
LAB_0012b283:
        mstate(data,CVar20);
        bVar22 = false;
LAB_0012b5d0:
        iVar13 = -1;
        break;
      case CURLM_STATE_COMPLETED:
        data->easy_conn = (connectdata *)0x0;
        Curl_expire_clear(data);
LAB_0012af9c:
        bVar22 = false;
LAB_0012b5bb:
        iVar13 = 0;
        break;
      case CURLM_STATE_MSGSENT:
        data->result = status;
        return CURLM_OK;
      default:
        return CURLM_INTERNAL_ERROR;
      }
      CVar20 = data->mstate;
      if (CVar20 < CURLM_STATE_COMPLETED) {
        if (status == CURLE_OK) {
          status = CURLE_OK;
          if ((*ppcVar21 != (connectdata *)0x0) &&
             (iVar12 = Curl_pgrsUpdate(*ppcVar21), iVar12 != 0)) {
            Curl_conncontrol(data->easy_conn,2);
            CVar20 = CURLM_STATE_COMPLETED - (data->mstate < CURLM_STATE_DONE);
            status = CURLE_ABORTED_BY_CALLBACK;
            iVar13 = -1;
            goto LAB_0012b696;
          }
        }
        else {
          (data->state).pipe_broke = false;
          Curl_multi_process_pending_handles(multi);
          if (data->easy_conn == (connectdata *)0x0) {
            if (data->mstate == CURLM_STATE_CONNECT) {
              Curl_posttransfer(data);
            }
          }
          else {
            Curl_pipeline_leave_write(data->easy_conn);
            Curl_pipeline_leave_read(data->easy_conn);
            Curl_removeHandleFromPipeline(data,data->easy_conn->send_pipe);
            Curl_removeHandleFromPipeline(data,data->easy_conn->recv_pipe);
            if (bVar22) {
              Curl_disconnect(*ppcVar21,status == CURLE_OPERATION_TIMEDOUT);
              *ppcVar21 = (connectdata *)0x0;
            }
          }
          CVar20 = CURLM_STATE_COMPLETED;
LAB_0012b696:
          mstate(data,CVar20);
        }
        CVar20 = data->mstate;
      }
      if (CVar20 == CURLM_STATE_COMPLETED) {
        (data->msg).extmsg.msg = CURLMSG_DONE;
        (data->msg).extmsg.easy_handle = data;
        (data->msg).extmsg.data.result = status;
        iVar13 = Curl_llist_insert_next(multi->msglist,multi->msglist->tail,&data->msg);
        CVar14 = (uint)(iVar13 == 0) * 3;
        mstate(data,CURLM_STATE_MSGSENT);
      }
      else {
LAB_0012b6de:
        CVar14 = CURLM_OK;
        if (iVar13 == -1) goto LAB_0012a88a;
      }
    } while (multi->recheckstate != false);
    data->result = status;
  }
  return CVar14;
}

Assistant:

static CURLMcode multi_runsingle(struct Curl_multi *multi,
                                 struct timeval now,
                                 struct Curl_easy *data)
{
  struct Curl_message *msg = NULL;
  bool connected;
  bool async;
  bool protocol_connect = FALSE;
  bool dophase_done = FALSE;
  bool done = FALSE;
  CURLMcode rc;
  CURLcode result = CURLE_OK;
  struct SingleRequest *k;
  time_t timeout_ms;
  time_t recv_timeout_ms;
  time_t send_timeout_ms;
  int control;

  if(!GOOD_EASY_HANDLE(data))
    return CURLM_BAD_EASY_HANDLE;

  do {
    /* A "stream" here is a logical stream if the protocol can handle that
       (HTTP/2), or the full connection for older protocols */
    bool stream_error = FALSE;
    rc = CURLM_OK;

    /* Handle the case when the pipe breaks, i.e., the connection
       we're using gets cleaned up and we're left with nothing. */
    if(data->state.pipe_broke) {
      infof(data, "Pipe broke: handle %p, url = %s\n",
            (void *)data, data->state.path);

      if(data->mstate < CURLM_STATE_COMPLETED) {
        /* Head back to the CONNECT state */
        multistate(data, CURLM_STATE_CONNECT);
        rc = CURLM_CALL_MULTI_PERFORM;
        result = CURLE_OK;
      }

      data->state.pipe_broke = FALSE;
      data->easy_conn = NULL;
      continue;
    }

    if(!data->easy_conn &&
       data->mstate > CURLM_STATE_CONNECT &&
       data->mstate < CURLM_STATE_DONE) {
      /* In all these states, the code will blindly access 'data->easy_conn'
         so this is precaution that it isn't NULL. And it silences static
         analyzers. */
      failf(data, "In state %d with no easy_conn, bail out!\n", data->mstate);
      return CURLM_INTERNAL_ERROR;
    }

    if(multi_ischanged(multi, TRUE)) {
      DEBUGF(infof(data, "multi changed, check CONNECT_PEND queue!\n"));
      Curl_multi_process_pending_handles(multi);
    }

    if(data->easy_conn && data->mstate > CURLM_STATE_CONNECT &&
       data->mstate < CURLM_STATE_COMPLETED)
      /* Make sure we set the connection's current owner */
      data->easy_conn->data = data;

    if(data->easy_conn &&
       (data->mstate >= CURLM_STATE_CONNECT) &&
       (data->mstate < CURLM_STATE_COMPLETED)) {
      /* we need to wait for the connect state as only then is the start time
         stored, but we must not check already completed handles */

      timeout_ms = Curl_timeleft(data, &now,
                                 (data->mstate <= CURLM_STATE_WAITDO)?
                                 TRUE:FALSE);

      if(timeout_ms < 0) {
        /* Handle timed out */
        if(data->mstate == CURLM_STATE_WAITRESOLVE)
          failf(data, "Resolving timed out after %ld milliseconds",
                Curl_tvdiff(now, data->progress.t_startsingle));
        else if(data->mstate == CURLM_STATE_WAITCONNECT)
          failf(data, "Connection timed out after %ld milliseconds",
                Curl_tvdiff(now, data->progress.t_startsingle));
        else {
          k = &data->req;
          if(k->size != -1) {
            failf(data, "Operation timed out after %ld milliseconds with %"
                  CURL_FORMAT_CURL_OFF_T " out of %"
                  CURL_FORMAT_CURL_OFF_T " bytes received",
                  Curl_tvdiff(now, data->progress.t_startsingle),
                  k->bytecount, k->size);
          }
          else {
            failf(data, "Operation timed out after %ld milliseconds with %"
                  CURL_FORMAT_CURL_OFF_T " bytes received",
                  Curl_tvdiff(now, data->progress.t_startsingle),
                  k->bytecount);
          }
        }

        /* Force connection closed if the connection has indeed been used */
        if(data->mstate > CURLM_STATE_DO) {
          streamclose(data->easy_conn, "Disconnected with pending data");
          stream_error = TRUE;
        }
        result = CURLE_OPERATION_TIMEDOUT;
        (void)multi_done(&data->easy_conn, result, TRUE);
        /* Skip the statemachine and go directly to error handling section. */
        goto statemachine_end;
      }
    }

    switch(data->mstate) {
    case CURLM_STATE_INIT:
      /* init this transfer. */
      result=Curl_pretransfer(data);

      if(!result) {
        /* after init, go CONNECT */
        multistate(data, CURLM_STATE_CONNECT);
        Curl_pgrsTime(data, TIMER_STARTOP);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      break;

    case CURLM_STATE_CONNECT_PEND:
      /* We will stay here until there is a connection available. Then
         we try again in the CURLM_STATE_CONNECT state. */
      break;

    case CURLM_STATE_CONNECT:
      /* Connect. We want to get a connection identifier filled in. */
      Curl_pgrsTime(data, TIMER_STARTSINGLE);
      result = Curl_connect(data, &data->easy_conn,
                            &async, &protocol_connect);
      if(CURLE_NO_CONNECTION_AVAILABLE == result) {
        /* There was no connection available. We will go to the pending
           state and wait for an available connection. */
        multistate(data, CURLM_STATE_CONNECT_PEND);

        /* add this handle to the list of connect-pending handles */
        if(!Curl_llist_insert_next(multi->pending, multi->pending->tail, data))
          result = CURLE_OUT_OF_MEMORY;
        else
          result = CURLE_OK;
        break;
      }

      if(!result) {
        /* Add this handle to the send or pend pipeline */
        result = Curl_add_handle_to_pipeline(data, data->easy_conn);
        if(result)
          stream_error = TRUE;
        else {
          if(async)
            /* We're now waiting for an asynchronous name lookup */
            multistate(data, CURLM_STATE_WAITRESOLVE);
          else {
            /* after the connect has been sent off, go WAITCONNECT unless the
               protocol connect is already done and we can go directly to
               WAITDO or DO! */
            rc = CURLM_CALL_MULTI_PERFORM;

            if(protocol_connect)
              multistate(data, Curl_pipeline_wanted(multi, CURLPIPE_HTTP1)?
                         CURLM_STATE_WAITDO:CURLM_STATE_DO);
            else {
#ifndef CURL_DISABLE_HTTP
              if(data->easy_conn->tunnel_state[FIRSTSOCKET] == TUNNEL_CONNECT)
                multistate(data, CURLM_STATE_WAITPROXYCONNECT);
              else
#endif
                multistate(data, CURLM_STATE_WAITCONNECT);
            }
          }
        }
      }
      break;

    case CURLM_STATE_WAITRESOLVE:
      /* awaiting an asynch name resolve to complete */
    {
      struct Curl_dns_entry *dns = NULL;
      struct connectdata *conn = data->easy_conn;
      const char *hostname;

      if(conn->bits.httpproxy)
        hostname = conn->http_proxy.host.name;
      else if(conn->bits.conn_to_host)
        hostname = conn->conn_to_host.name;
      else
        hostname = conn->host.name;

      /* check if we have the name resolved by now */
      dns = Curl_fetch_addr(conn, hostname, (int)conn->port);

      if(dns) {
#ifdef CURLRES_ASYNCH
        conn->async.dns = dns;
        conn->async.done = TRUE;
#endif
        result = CURLE_OK;
        infof(data, "Hostname '%s' was found in DNS cache\n", hostname);
      }

      if(!dns)
        result = Curl_resolver_is_resolved(data->easy_conn, &dns);

      /* Update sockets here, because the socket(s) may have been
         closed and the application thus needs to be told, even if it
         is likely that the same socket(s) will again be used further
         down.  If the name has not yet been resolved, it is likely
         that new sockets have been opened in an attempt to contact
         another resolver. */
      singlesocket(multi, data);

      if(dns) {
        /* Perform the next step in the connection phase, and then move on
           to the WAITCONNECT state */
        result = Curl_async_resolved(data->easy_conn, &protocol_connect);

        if(result)
          /* if Curl_async_resolved() returns failure, the connection struct
             is already freed and gone */
          data->easy_conn = NULL;           /* no more connection */
        else {
          /* call again please so that we get the next socket setup */
          rc = CURLM_CALL_MULTI_PERFORM;
          if(protocol_connect)
            multistate(data, Curl_pipeline_wanted(multi, CURLPIPE_HTTP1)?
                       CURLM_STATE_WAITDO:CURLM_STATE_DO);
          else {
#ifndef CURL_DISABLE_HTTP
            if(data->easy_conn->tunnel_state[FIRSTSOCKET] == TUNNEL_CONNECT)
              multistate(data, CURLM_STATE_WAITPROXYCONNECT);
            else
#endif
              multistate(data, CURLM_STATE_WAITCONNECT);
          }
        }
      }

      if(result) {
        /* failure detected */
        stream_error = TRUE;
        break;
      }
    }
    break;

#ifndef CURL_DISABLE_HTTP
    case CURLM_STATE_WAITPROXYCONNECT:
      /* this is HTTP-specific, but sending CONNECT to a proxy is HTTP... */
      result = Curl_http_connect(data->easy_conn, &protocol_connect);

      if(data->easy_conn->bits.proxy_connect_closed) {
        rc = CURLM_CALL_MULTI_PERFORM;
        /* connect back to proxy again */
        result = CURLE_OK;
        multi_done(&data->easy_conn, CURLE_OK, FALSE);
        multistate(data, CURLM_STATE_CONNECT);
      }
      else if(!result) {
        if((data->easy_conn->http_proxy.proxytype != CURLPROXY_HTTPS ||
           data->easy_conn->bits.proxy_ssl_connected[FIRSTSOCKET]) &&
           (data->easy_conn->tunnel_state[FIRSTSOCKET] != TUNNEL_CONNECT)) {
          rc = CURLM_CALL_MULTI_PERFORM;
          /* initiate protocol connect phase */
          multistate(data, CURLM_STATE_SENDPROTOCONNECT);
        }
      }
      break;
#endif

    case CURLM_STATE_WAITCONNECT:
      /* awaiting a completion of an asynch TCP connect */
      result = Curl_is_connected(data->easy_conn, FIRSTSOCKET, &connected);
      if(connected && !result) {
#ifndef CURL_DISABLE_HTTP
        if((data->easy_conn->http_proxy.proxytype == CURLPROXY_HTTPS &&
            !data->easy_conn->bits.proxy_ssl_connected[FIRSTSOCKET]) ||
            (data->easy_conn->tunnel_state[FIRSTSOCKET] == TUNNEL_CONNECT)) {
          multistate(data, CURLM_STATE_WAITPROXYCONNECT);
          break;
        }
#endif
        rc = CURLM_CALL_MULTI_PERFORM;
        multistate(data, data->easy_conn->bits.tunnel_proxy?
                   CURLM_STATE_WAITPROXYCONNECT:
                   CURLM_STATE_SENDPROTOCONNECT);
      }
      else if(result) {
        /* failure detected */
        /* Just break, the cleaning up is handled all in one place */
        stream_error = TRUE;
        break;
      }
      break;

    case CURLM_STATE_SENDPROTOCONNECT:
      result = Curl_protocol_connect(data->easy_conn, &protocol_connect);
      if(!protocol_connect)
        /* switch to waiting state */
        multistate(data, CURLM_STATE_PROTOCONNECT);
      else if(!result) {
        /* protocol connect has completed, go WAITDO or DO */
        multistate(data, Curl_pipeline_wanted(multi, CURLPIPE_HTTP1)?
                   CURLM_STATE_WAITDO:CURLM_STATE_DO);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      else if(result) {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(&data->easy_conn, result, TRUE);
        stream_error = TRUE;
      }
      break;

    case CURLM_STATE_PROTOCONNECT:
      /* protocol-specific connect phase */
      result = Curl_protocol_connecting(data->easy_conn, &protocol_connect);
      if(!result && protocol_connect) {
        /* after the connect has completed, go WAITDO or DO */
        multistate(data, Curl_pipeline_wanted(multi, CURLPIPE_HTTP1)?
                   CURLM_STATE_WAITDO:CURLM_STATE_DO);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      else if(result) {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(&data->easy_conn, result, TRUE);
        stream_error = TRUE;
      }
      break;

    case CURLM_STATE_WAITDO:
      /* Wait for our turn to DO when we're pipelining requests */
      if(Curl_pipeline_checkget_write(data, data->easy_conn)) {
        /* Grabbed the channel */
        multistate(data, CURLM_STATE_DO);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      break;

    case CURLM_STATE_DO:
      if(data->set.connect_only) {
        /* keep connection open for application to use the socket */
        connkeep(data->easy_conn, "CONNECT_ONLY");
        multistate(data, CURLM_STATE_DONE);
        result = CURLE_OK;
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      else {
        /* Perform the protocol's DO action */
        result = multi_do(&data->easy_conn, &dophase_done);

        /* When multi_do() returns failure, data->easy_conn might be NULL! */

        if(!result) {
          if(!dophase_done) {
            /* some steps needed for wildcard matching */
            if(data->set.wildcardmatch) {
              struct WildcardData *wc = &data->wildcard;
              if(wc->state == CURLWC_DONE || wc->state == CURLWC_SKIP) {
                /* skip some states if it is important */
                multi_done(&data->easy_conn, CURLE_OK, FALSE);
                multistate(data, CURLM_STATE_DONE);
                rc = CURLM_CALL_MULTI_PERFORM;
                break;
              }
            }
            /* DO was not completed in one function call, we must continue
               DOING... */
            multistate(data, CURLM_STATE_DOING);
            rc = CURLM_OK;
          }

          /* after DO, go DO_DONE... or DO_MORE */
          else if(data->easy_conn->bits.do_more) {
            /* we're supposed to do more, but we need to sit down, relax
               and wait a little while first */
            multistate(data, CURLM_STATE_DO_MORE);
            rc = CURLM_OK;
          }
          else {
            /* we're done with the DO, now DO_DONE */
            multistate(data, CURLM_STATE_DO_DONE);
            rc = CURLM_CALL_MULTI_PERFORM;
          }
        }
        else if((CURLE_SEND_ERROR == result) &&
                data->easy_conn->bits.reuse) {
          /*
           * In this situation, a connection that we were trying to use
           * may have unexpectedly died.  If possible, send the connection
           * back to the CONNECT phase so we can try again.
           */
          char *newurl = NULL;
          followtype follow=FOLLOW_NONE;
          CURLcode drc;
          bool retry = FALSE;

          drc = Curl_retry_request(data->easy_conn, &newurl);
          if(drc) {
            /* a failure here pretty much implies an out of memory */
            result = drc;
            stream_error = TRUE;
          }
          else
            retry = (newurl)?TRUE:FALSE;

          Curl_posttransfer(data);
          drc = multi_done(&data->easy_conn, result, FALSE);

          /* When set to retry the connection, we must to go back to
           * the CONNECT state */
          if(retry) {
            if(!drc || (drc == CURLE_SEND_ERROR)) {
              follow = FOLLOW_RETRY;
              drc = Curl_follow(data, newurl, follow);
              if(!drc) {
                multistate(data, CURLM_STATE_CONNECT);
                rc = CURLM_CALL_MULTI_PERFORM;
                result = CURLE_OK;
              }
              else {
                /* Follow failed */
                result = drc;
                free(newurl);
              }
            }
            else {
              /* done didn't return OK or SEND_ERROR */
              result = drc;
              free(newurl);
            }
          }
          else {
            /* Have error handler disconnect conn if we can't retry */
            stream_error = TRUE;
            free(newurl);
          }
        }
        else {
          /* failure detected */
          Curl_posttransfer(data);
          if(data->easy_conn)
            multi_done(&data->easy_conn, result, FALSE);
          stream_error = TRUE;
        }
      }
      break;

    case CURLM_STATE_DOING:
      /* we continue DOING until the DO phase is complete */
      result = Curl_protocol_doing(data->easy_conn,
                                   &dophase_done);
      if(!result) {
        if(dophase_done) {
          /* after DO, go DO_DONE or DO_MORE */
          multistate(data, data->easy_conn->bits.do_more?
                     CURLM_STATE_DO_MORE:
                     CURLM_STATE_DO_DONE);
          rc = CURLM_CALL_MULTI_PERFORM;
        } /* dophase_done */
      }
      else {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(&data->easy_conn, result, FALSE);
        stream_error = TRUE;
      }
      break;

    case CURLM_STATE_DO_MORE:
      /*
       * When we are connected, DO MORE and then go DO_DONE
       */
      result = multi_do_more(data->easy_conn, &control);

      /* No need to remove this handle from the send pipeline here since that
         is done in multi_done() */
      if(!result) {
        if(control) {
          /* if positive, advance to DO_DONE
             if negative, go back to DOING */
          multistate(data, control==1?
                     CURLM_STATE_DO_DONE:
                     CURLM_STATE_DOING);
          rc = CURLM_CALL_MULTI_PERFORM;
        }
        else
          /* stay in DO_MORE */
          rc = CURLM_OK;
      }
      else {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(&data->easy_conn, result, FALSE);
        stream_error = TRUE;
      }
      break;

    case CURLM_STATE_DO_DONE:
      /* Move ourselves from the send to recv pipeline */
      Curl_move_handle_from_send_to_recv_pipe(data, data->easy_conn);
      /* Check if we can move pending requests to send pipe */
      Curl_multi_process_pending_handles(multi);

      /* Only perform the transfer if there's a good socket to work with.
         Having both BAD is a signal to skip immediately to DONE */
      if((data->easy_conn->sockfd != CURL_SOCKET_BAD) ||
         (data->easy_conn->writesockfd != CURL_SOCKET_BAD))
        multistate(data, CURLM_STATE_WAITPERFORM);
      else
        multistate(data, CURLM_STATE_DONE);
      rc = CURLM_CALL_MULTI_PERFORM;
      break;

    case CURLM_STATE_WAITPERFORM:
      /* Wait for our turn to PERFORM */
      if(Curl_pipeline_checkget_read(data, data->easy_conn)) {
        /* Grabbed the channel */
        multistate(data, CURLM_STATE_PERFORM);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      break;

    case CURLM_STATE_TOOFAST: /* limit-rate exceeded in either direction */
      /* if both rates are within spec, resume transfer */
      if(Curl_pgrsUpdate(data->easy_conn))
        result = CURLE_ABORTED_BY_CALLBACK;
      else
        result = Curl_speedcheck(data, now);

      if(!result) {
        send_timeout_ms = 0;
        if(data->set.max_send_speed > 0)
          send_timeout_ms = Curl_pgrsLimitWaitTime(data->progress.uploaded,
                                data->progress.ul_limit_size,
                                data->set.max_send_speed,
                                data->progress.ul_limit_start,
                                now);

        recv_timeout_ms = 0;
        if(data->set.max_recv_speed > 0)
          recv_timeout_ms = Curl_pgrsLimitWaitTime(data->progress.downloaded,
                                data->progress.dl_limit_size,
                                data->set.max_recv_speed,
                                data->progress.dl_limit_start,
                                now);

        if(send_timeout_ms <= 0 && recv_timeout_ms <= 0)
          multistate(data, CURLM_STATE_PERFORM);
        else if(send_timeout_ms >= recv_timeout_ms)
          Curl_expire_latest(data, send_timeout_ms);
        else
          Curl_expire_latest(data, recv_timeout_ms);
      }
      break;

    case CURLM_STATE_PERFORM:
    {
      char *newurl = NULL;
      bool retry = FALSE;
      bool comeback = FALSE;

      /* check if over send speed */
      send_timeout_ms = 0;
      if(data->set.max_send_speed > 0)
        send_timeout_ms = Curl_pgrsLimitWaitTime(data->progress.uploaded,
                                                 data->progress.ul_limit_size,
                                                 data->set.max_send_speed,
                                                 data->progress.ul_limit_start,
                                                 now);

      /* check if over recv speed */
      recv_timeout_ms = 0;
      if(data->set.max_recv_speed > 0)
        recv_timeout_ms = Curl_pgrsLimitWaitTime(data->progress.downloaded,
                                                 data->progress.dl_limit_size,
                                                 data->set.max_recv_speed,
                                                 data->progress.dl_limit_start,
                                                 now);

      if(send_timeout_ms > 0 || recv_timeout_ms > 0) {
        multistate(data, CURLM_STATE_TOOFAST);
        if(send_timeout_ms >= recv_timeout_ms)
          Curl_expire_latest(data, send_timeout_ms);
        else
          Curl_expire_latest(data, recv_timeout_ms);
        break;
      }

      /* read/write data if it is ready to do so */
      result = Curl_readwrite(data->easy_conn, data, &done, &comeback);

      k = &data->req;

      if(!(k->keepon & KEEP_RECV))
        /* We're done receiving */
        Curl_pipeline_leave_read(data->easy_conn);

      if(!(k->keepon & KEEP_SEND))
        /* We're done sending */
        Curl_pipeline_leave_write(data->easy_conn);

      if(done || (result == CURLE_RECV_ERROR)) {
        /* If CURLE_RECV_ERROR happens early enough, we assume it was a race
         * condition and the server closed the re-used connection exactly when
         * we wanted to use it, so figure out if that is indeed the case.
         */
        CURLcode ret = Curl_retry_request(data->easy_conn, &newurl);
        if(!ret)
          retry = (newurl)?TRUE:FALSE;

        if(retry) {
          /* if we are to retry, set the result to OK and consider the
             request as done */
          result = CURLE_OK;
          done = TRUE;
        }
      }

      if(result) {
        /*
         * The transfer phase returned error, we mark the connection to get
         * closed to prevent being re-used. This is because we can't possibly
         * know if the connection is in a good shape or not now.  Unless it is
         * a protocol which uses two "channels" like FTP, as then the error
         * happened in the data connection.
         */

        if(!(data->easy_conn->handler->flags & PROTOPT_DUAL) &&
           result != CURLE_HTTP2_STREAM)
          streamclose(data->easy_conn, "Transfer returned error");

        Curl_posttransfer(data);
        multi_done(&data->easy_conn, result, TRUE);
      }
      else if(done) {
        followtype follow=FOLLOW_NONE;

        /* call this even if the readwrite function returned error */
        Curl_posttransfer(data);

        /* we're no longer receiving */
        Curl_removeHandleFromPipeline(data, data->easy_conn->recv_pipe);

        /* expire the new receiving pipeline head */
        if(data->easy_conn->recv_pipe->head)
          Curl_expire_latest(data->easy_conn->recv_pipe->head->ptr, 0);

        /* Check if we can move pending requests to send pipe */
        Curl_multi_process_pending_handles(multi);

        /* When we follow redirects or is set to retry the connection, we must
           to go back to the CONNECT state */
        if(data->req.newurl || retry) {
          if(!retry) {
            /* if the URL is a follow-location and not just a retried request
               then figure out the URL here */
            free(newurl);
            newurl = data->req.newurl;
            data->req.newurl = NULL;
            follow = FOLLOW_REDIR;
          }
          else
            follow = FOLLOW_RETRY;
          result = multi_done(&data->easy_conn, CURLE_OK, FALSE);
          if(!result) {
            result = Curl_follow(data, newurl, follow);
            if(!result) {
              multistate(data, CURLM_STATE_CONNECT);
              rc = CURLM_CALL_MULTI_PERFORM;
              newurl = NULL; /* handed over the memory ownership to
                                Curl_follow(), make sure we don't free() it
                                here */
            }
          }
        }
        else {
          /* after the transfer is done, go DONE */

          /* but first check to see if we got a location info even though we're
             not following redirects */
          if(data->req.location) {
            free(newurl);
            newurl = data->req.location;
            data->req.location = NULL;
            result = Curl_follow(data, newurl, FOLLOW_FAKE);
            if(!result)
              newurl = NULL; /* allocation was handed over Curl_follow() */
            else
              stream_error = TRUE;
          }

          multistate(data, CURLM_STATE_DONE);
          rc = CURLM_CALL_MULTI_PERFORM;
        }
      }
      else if(comeback)
        rc = CURLM_CALL_MULTI_PERFORM;

      free(newurl);
      break;
    }

    case CURLM_STATE_DONE:
      /* this state is highly transient, so run another loop after this */
      rc = CURLM_CALL_MULTI_PERFORM;

      if(data->easy_conn) {
        CURLcode res;

        /* Remove ourselves from the receive pipeline, if we are there. */
        Curl_removeHandleFromPipeline(data, data->easy_conn->recv_pipe);
        /* Check if we can move pending requests to send pipe */
        Curl_multi_process_pending_handles(multi);

        /* post-transfer command */
        res = multi_done(&data->easy_conn, result, FALSE);

        /* allow a previously set error code take precedence */
        if(!result)
          result = res;

        /*
         * If there are other handles on the pipeline, multi_done won't set
         * easy_conn to NULL.  In such a case, curl_multi_remove_handle() can
         * access free'd data, if the connection is free'd and the handle
         * removed before we perform the processing in CURLM_STATE_COMPLETED
         */
        if(data->easy_conn)
          data->easy_conn = NULL;
      }

      if(data->set.wildcardmatch) {
        if(data->wildcard.state != CURLWC_DONE) {
          /* if a wildcard is set and we are not ending -> lets start again
             with CURLM_STATE_INIT */
          multistate(data, CURLM_STATE_INIT);
          break;
        }
      }

      /* after we have DONE what we're supposed to do, go COMPLETED, and
         it doesn't matter what the multi_done() returned! */
      multistate(data, CURLM_STATE_COMPLETED);
      break;

    case CURLM_STATE_COMPLETED:
      /* this is a completed transfer, it is likely to still be connected */

      /* This node should be delinked from the list now and we should post
         an information message that we are complete. */

      /* Important: reset the conn pointer so that we don't point to memory
         that could be freed anytime */
      data->easy_conn = NULL;

      Curl_expire_clear(data); /* stop all timers */
      break;

    case CURLM_STATE_MSGSENT:
      data->result = result;
      return CURLM_OK; /* do nothing */

    default:
      return CURLM_INTERNAL_ERROR;
    }
    statemachine_end:

    if(data->mstate < CURLM_STATE_COMPLETED) {
      if(result) {
        /*
         * If an error was returned, and we aren't in completed state now,
         * then we go to completed and consider this transfer aborted.
         */

        /* NOTE: no attempt to disconnect connections must be made
           in the case blocks above - cleanup happens only here */

        data->state.pipe_broke = FALSE;

        /* Check if we can move pending requests to send pipe */
        Curl_multi_process_pending_handles(multi);

        if(data->easy_conn) {
          /* if this has a connection, unsubscribe from the pipelines */
          Curl_pipeline_leave_write(data->easy_conn);
          Curl_pipeline_leave_read(data->easy_conn);
          Curl_removeHandleFromPipeline(data, data->easy_conn->send_pipe);
          Curl_removeHandleFromPipeline(data, data->easy_conn->recv_pipe);

          if(stream_error) {
            /* Don't attempt to send data over a connection that timed out */
            bool dead_connection = result == CURLE_OPERATION_TIMEDOUT;
            /* disconnect properly */
            Curl_disconnect(data->easy_conn, dead_connection);

            /* This is where we make sure that the easy_conn pointer is reset.
               We don't have to do this in every case block above where a
               failure is detected */
            data->easy_conn = NULL;
          }
        }
        else if(data->mstate == CURLM_STATE_CONNECT) {
          /* Curl_connect() failed */
          (void)Curl_posttransfer(data);
        }

        multistate(data, CURLM_STATE_COMPLETED);
      }
      /* if there's still a connection to use, call the progress function */
      else if(data->easy_conn && Curl_pgrsUpdate(data->easy_conn)) {
        /* aborted due to progress callback return code must close the
           connection */
        result = CURLE_ABORTED_BY_CALLBACK;
        streamclose(data->easy_conn, "Aborted by callback");

        /* if not yet in DONE state, go there, otherwise COMPLETED */
        multistate(data, (data->mstate < CURLM_STATE_DONE)?
                   CURLM_STATE_DONE: CURLM_STATE_COMPLETED);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
    }

    if(CURLM_STATE_COMPLETED == data->mstate) {
      /* now fill in the Curl_message with this info */
      msg = &data->msg;

      msg->extmsg.msg = CURLMSG_DONE;
      msg->extmsg.easy_handle = data;
      msg->extmsg.data.result = result;

      rc = multi_addmsg(multi, msg);

      multistate(data, CURLM_STATE_MSGSENT);
    }
  } while((rc == CURLM_CALL_MULTI_PERFORM) || multi_ischanged(multi, FALSE));

  data->result = result;


  return rc;
}